

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O3

int __thiscall llvm::APInt::abs(APInt *this,int __x)

{
  bool bVar1;
  anon_union_8_2_1313ab2f_for_U __dest;
  undefined4 in_register_00000034;
  APInt *this_00;
  ulong __n;
  anon_union_8_2_1313ab2f_for_U local_30;
  uint local_28;
  
  this_00 = (APInt *)CONCAT44(in_register_00000034,__x);
  bVar1 = operator[](this_00,this_00->BitWidth - 1);
  if (bVar1) {
    local_28 = this_00->BitWidth;
    if ((ulong)local_28 < 0x41) {
      __dest.pVal = *(uint64_t **)&this_00->U;
    }
    else {
      __n = (ulong)((uint)((ulong)local_28 + 0x3f >> 3) & 0xfffffff8);
      __dest.pVal = (uint64_t *)operator_new__(__n);
      memcpy(__dest.pVal,(this_00->U).pVal,__n);
    }
    local_30 = __dest;
    flipAllBits((APInt *)&local_30);
    operator++((APInt *)&local_30);
    this->BitWidth = local_28;
    this->U = local_30;
  }
  else {
    APInt(this,this_00);
  }
  return (int)this;
}

Assistant:

APInt abs() const {
    if (isNegative())
      return -(*this);
    return *this;
  }